

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_GetP2wshLockingScriptTest_Test::~ScriptUtil_GetP2wshLockingScriptTest_Test
          (ScriptUtil_GetP2wshLockingScriptTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptUtil, GetP2wshLockingScriptTest) {
  const std::vector<ScriptUtil_ScriptTestVector> test_vectors = {
    {
      // 00 11 2222 333333 4444 55 6666 777777 8888 99
      Script("01000111022222033333330244440155026666037777770288880199"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437")
    },
    {
      // p2pkh locking script
      Script("76a914edaf2414751239b72b653ea004adc310a3522e3788ac"),
      Script("002049672615b13c511f9cef005d2290211c5924e28da4d68f5a8c6dfd1f108bf388")
    },
    {
      // p2wpkh locking script
      Script("0014edaf2414751239b72b653ea004adc310a3522e37"),
      Script("0020c1a9921421f2ac0e76533e25ca211e6a1f9465bdf9931f5e9039dbdfdace0fa4")
    },
  };

  Script actual;
  for (const ScriptUtil_ScriptTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wshLockingScript(test_vector.input_redeem_script)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
    ByteData256 script_hash = HashUtil::Sha256(test_vector.input_redeem_script);
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wshLockingScript(script_hash)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}